

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionControlElement::IfcDistributionControlElement
          (IfcDistributionControlElement *this)

{
  *(undefined ***)&this->field_0x180 = &PTR__Object_007331c0;
  *(undefined8 *)&this->field_0x188 = 0;
  *(char **)&this->field_0x190 = "IfcDistributionControlElement";
  IfcDistributionElement::IfcDistributionElement
            ((IfcDistributionElement *)this,&PTR_construction_vtable_24__007a33a8);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElement,_1UL>).
  aux_is_derived.super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x7a3278;
  *(undefined8 *)&this->field_0x180 = 0x7a3390;
  *(undefined8 *)&this->field_0x88 = 0x7a32a0;
  *(undefined8 *)&this->field_0x98 = 0x7a32c8;
  *(undefined8 *)&this->field_0xd0 = 0x7a32f0;
  *(undefined8 *)&this->field_0x100 = 0x7a3318;
  *(undefined8 *)&this->field_0x138 = 0x7a3340;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElement,_1UL>).
  _vptr_ObjectHelper = (_func_int **)0x7a3368;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElement,_1UL>).
    field_0x10 = &(this->
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElement,_1UL>).
                  field_0x20;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElement,_1UL>).
    field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElement,_1UL>).field_0x20
       = 0;
  this->field_0x178 = 0;
  return;
}

Assistant:

IfcDistributionControlElement() : Object("IfcDistributionControlElement") {}